

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetContentRegionMaxAbs(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  IVar2 = (pIVar1->ContentRegionRect).Max;
  if (((pIVar1->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
     (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
    IVar2.x = (pIVar1->WorkRect).Max.x;
  }
  return IVar2;
}

Assistant:

ImVec2 ImGui::GetContentRegionMaxAbs()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max;
    if (window->DC.CurrentColumns || g.CurrentTable)
        mx.x = window->WorkRect.Max.x;
    return mx;
}